

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  long lVar1;
  int local_24;
  long lStack_20;
  int i;
  size_t index;
  uint8_t em_bits;
  uint8_t em_codes [4];
  ansi_color_escape<char> *paStack_10;
  emphasis em_local;
  ansi_color_escape<char> *this_local;
  
  index._7_1_ = em;
  paStack_10 = this;
  memset((void *)((long)&index + 3),0,4);
  if ((index._7_1_ & bold) != 0) {
    index._3_1_ = 1;
  }
  if ((index._7_1_ & italic) != 0) {
    index._4_1_ = 3;
  }
  if ((index._7_1_ & underline) != 0) {
    index._5_1_ = 4;
  }
  if ((index._7_1_ & strikethrough) != 0) {
    index._6_1_ = 9;
  }
  lStack_20 = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if (*(char *)((long)&index + (long)local_24 + 3) != '\0') {
      this->buffer[lStack_20] = '\x1b';
      this->buffer[lStack_20 + 1] = '[';
      lVar1 = lStack_20 + 3;
      this->buffer[lStack_20 + 2] = *(char *)((long)&index + (long)local_24 + 3) + '0';
      lStack_20 = lStack_20 + 4;
      this->buffer[lVar1] = 'm';
    }
  }
  this->buffer[lStack_20] = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) FMT_NOEXCEPT {
    uint8_t em_codes[4] = {};
    uint8_t em_bits = static_cast<uint8_t>(em);
    if (em_bits & static_cast<uint8_t>(emphasis::bold)) em_codes[0] = 1;
    if (em_bits & static_cast<uint8_t>(emphasis::italic)) em_codes[1] = 3;
    if (em_bits & static_cast<uint8_t>(emphasis::underline)) em_codes[2] = 4;
    if (em_bits & static_cast<uint8_t>(emphasis::strikethrough))
      em_codes[3] = 9;

    size_t index = 0;
    for (int i = 0; i < 4; ++i) {
      if (!em_codes[i]) continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }